

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# belt_fmt.c
# Opt level: O0

err_t beltFMTEncr(u16 *dest,u32 mod,u16 *src,size_t count,octet *key,size_t len,octet *iv)

{
  bool_t bVar1;
  blob_t dest_00;
  octet *in_RCX;
  u16 *in_RDX;
  void *in_RDI;
  void *in_R8;
  octet *in_R9;
  void *state;
  void *in_stack_ffffffffffffffb8;
  undefined8 in_stack_ffffffffffffffc0;
  u32 mod_00;
  
  mod_00 = (u32)((ulong)in_stack_ffffffffffffffc0 >> 0x20);
  if (((in_RCX < (octet *)0x2) ||
      ((((in_R9 != (octet *)0x10 && (in_R9 != (octet *)0x18)) && (in_R9 != (octet *)0x20)) ||
       (bVar1 = memIsValid(in_RDX,(long)in_RCX << 1), bVar1 == 0)))) ||
     ((((state != (void *)0x0 && (bVar1 = memIsValid(state,0x10), bVar1 == 0)) ||
       (bVar1 = memIsValid(in_R8,(size_t)in_R9), bVar1 == 0)) ||
      ((bVar1 = memIsValid(in_RDI,(long)in_RCX << 1), bVar1 == 0 ||
       ((state != (void *)0x0 &&
        (bVar1 = memIsDisjoint2(in_RDI,(long)in_RCX << 1,state,0x10), bVar1 == 0)))))))) {
    return 0x6d;
  }
  if ((octet *)0x258 < in_RCX) {
    return 0x77;
  }
  beltFMT_keep(mod_00,(size_t)in_stack_ffffffffffffffb8);
  dest_00 = blobCreate((size_t)in_stack_ffffffffffffffb8);
  if (dest_00 == (blob_t)0x0) {
    return 0x6e;
  }
  beltFMTStart(in_RDX,(u32)((ulong)in_RCX >> 0x20),(size_t)in_R8,in_R9,(size_t)dest_00);
  memMove(dest_00,in_stack_ffffffffffffffb8,0x15b16b);
  beltFMTStepE(in_RDX,in_RCX,in_R8);
  blobClose((blob_t)0x15b189);
  return 0;
}

Assistant:

err_t beltFMTEncr(u16 dest[], u32 mod, const u16 src[], size_t count,
	const octet key[], size_t len, const octet iv[16])
{
	void* state;
	// проверить входные данные
	if (count < 2 ||
		len != 16 && len != 24 && len != 32 ||
		!memIsValid(src, 2 * count) ||
		!memIsNullOrValid(iv, 16) ||
		!memIsValid(key, len) ||
		!memIsValid(dest, 2 * count) ||
		iv && !memIsDisjoint2(dest, 2 * count, iv, 16))
		return ERR_BAD_INPUT;
	if (count > 600)
		return ERR_NOT_IMPLEMENTED;
	// создать состояние
	state = blobCreate(beltFMT_keep(mod, count));
	if (state == 0)
		return ERR_OUTOFMEMORY;
	// зашифровать
	beltFMTStart(state, mod, count, key, len);
	memMove(dest, src, 2 * count);
	beltFMTStepE(dest, iv, state);
	// завершить
	blobClose(state);
	return ERR_OK;
}